

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  uint uVar1;
  char *pcVar2;
  char regnum_str [16];
  char var [64];
  char acStack_a8 [64];
  char local_68 [64];
  
  if (ttype - TEXTURE_TYPE_2D < 3) {
    pcVar2 = &DAT_00152b40 + *(int *)(&DAT_00152b40 + (ulong)(ttype - TEXTURE_TYPE_2D) * 4);
  }
  else {
    failf(ctx,"%s","BUG: used a sampler we don\'t know how to define.");
    pcVar2 = "";
  }
  snprintf(acStack_a8,0x10,"%u",(ulong)(uint)stage);
  snprintf(local_68,0x40,"%s_%s%s",ctx->shader_type_str,"s",acStack_a8);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"uniform %s %s;",pcVar2,local_68);
  if (tb != 0) {
    uVar1 = ctx->uniform_float4_count;
    ctx->uniform_float4_count = uVar1 + 2;
    snprintf(acStack_a8,0x40,"%s_uniforms_%s",ctx->shader_type_str,"vec4");
    output_line(ctx,"#define %s_texbem %s[%d]",local_68,acStack_a8,(ulong)uVar1);
    output_line(ctx,"#define %s_texbeml %s[%d]",local_68,acStack_a8,(ulong)(uVar1 + 1));
  }
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_GLSL_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    const char *type = "";
    switch (ttype)
    {
        case TEXTURE_TYPE_2D: type = "sampler2D"; break;
        case TEXTURE_TYPE_CUBE: type = "samplerCube"; break;
        case TEXTURE_TYPE_VOLUME: type = "sampler3D"; break;
        default: fail(ctx, "BUG: used a sampler we don't know how to define.");
    } // switch

    char var[64];
    get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof (var));

    push_output(ctx, &ctx->globals);
    output_line(ctx, "uniform %s %s;", type, var);
    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        char name[64];
        const int index = ctx->uniform_float4_count;
        ctx->uniform_float4_count += 2;
        get_GLSL_uniform_array_varname(ctx, REG_TYPE_CONST, name, sizeof (name));
        output_line(ctx, "#define %s_texbem %s[%d]", var, name, index);
        output_line(ctx, "#define %s_texbeml %s[%d]", var, name, index+1);
    } // if
    pop_output(ctx);
}